

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall kj::_::Coroutine<bool>::fulfill(Coroutine<bool> *this,FixVoid<bool> *value)

{
  ExceptionOr<bool> local_1a8;
  
  if ((this->super_CoroutineBase).waiting == true) {
    local_1a8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1a8.value.ptr.isSet = true;
    local_1a8.value.ptr.field_1.value = *value;
    ExceptionOr<bool>::operator=(&this->result,&local_1a8);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1a8);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }